

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
FIX::Session::nextResendRequest(Session *this,Message *resendRequest,UtcTimeStamp *timeStamp)

{
  SessionState *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer string;
  DataDictionary *dataDictionary;
  DataDictionary *applicationDataDictionary;
  message_order *pmVar5;
  message_order *pmVar6;
  message_order *pmVar7;
  Message *this_01;
  string *psVar8;
  size_t __n;
  signed_int value;
  signed_int value_00;
  signed_int value_01;
  void *__buf;
  uchar *in_R8;
  size_t in_R9;
  int local_470;
  int local_46c;
  string strMsgType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  MsgSeqNum msgSeqNum;
  EndSeqNo endSeqNo;
  ApplVerID applVerID;
  string beginString;
  string messageString;
  Message msg;
  BeginSeqNo beginSeqNo;
  MsgType msgType;
  FieldBase local_90;
  
  iVar2 = verify(this,(EVP_PKEY_CTX *)resendRequest,(uchar *)0x0,0,in_R8,in_R9);
  if ((char)iVar2 == '\0') {
    return;
  }
  Mutex::lock(&this->m_mutex);
  BeginSeqNo::BeginSeqNo(&beginSeqNo);
  EndSeqNo::EndSeqNo(&endSeqNo);
  FieldMap::getField(&resendRequest->super_FieldMap,(FieldBase *)&beginSeqNo);
  FieldMap::getField(&resendRequest->super_FieldMap,(FieldBase *)&endSeqNo);
  uVar3 = IntField::getValue(&beginSeqNo.super_SeqNumField);
  IntConvertor::convert_abi_cxx11_((string *)&applVerID,(IntConvertor *)(ulong)uVar3,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgType,
                 "Received ResendRequest FROM: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&applVerID);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgSeqNum,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgType,
                 " TO: ");
  uVar3 = IntField::getValue(&endSeqNo.super_SeqNumField);
  IntConvertor::convert_abi_cxx11_((string *)&local_90,(IntConvertor *)(ulong)uVar3,value_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgSeqNum,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  this_00 = &this->m_state;
  SessionState::onEvent(this_00,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&msgSeqNum);
  std::__cxx11::string::~string((string *)&msgType);
  std::__cxx11::string::~string((string *)&applVerID);
  std::__cxx11::string::string
            ((string *)&beginString,
             (string *)&(this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string
            );
  bVar1 = std::operator>=(&beginString,"FIX.4.2");
  if (((!bVar1) || (iVar2 = IntField::getValue(&endSeqNo.super_SeqNumField), iVar2 != 0)) &&
     ((bVar1 = std::operator<=(&beginString,"FIX.4.2"), !bVar1 ||
      (iVar2 = IntField::getValue(&endSeqNo.super_SeqNumField), iVar2 != 999999)))) {
    iVar2 = IntField::getValue(&endSeqNo.super_SeqNumField);
    iVar4 = SessionState::getNextSenderMsgSeqNum(this_00);
    if (iVar2 < iVar4) goto LAB_001a5f90;
  }
  iVar2 = SessionState::getNextSenderMsgSeqNum(this_00);
  msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase._0_4_ = iVar2 + -1;
  EndSeqNo::EndSeqNo((EndSeqNo *)&msg,(SEQNUM *)&msgSeqNum);
  FieldBase::operator=((FieldBase *)&endSeqNo,(FieldBase *)&msg);
  FieldBase::~FieldBase((FieldBase *)&msg);
LAB_001a5f90:
  if (this->m_persistMessages == false) {
    iVar2 = IntField::getValue(&endSeqNo.super_SeqNumField);
    msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase._0_4_ = iVar2 + 1;
    EndSeqNo::EndSeqNo((EndSeqNo *)&msg,(SEQNUM *)&msgSeqNum);
    FieldBase::operator=((FieldBase *)&endSeqNo,(FieldBase *)&msg);
    FieldBase::~FieldBase((FieldBase *)&msg);
    iVar2 = SessionState::getNextSenderMsgSeqNum(this_00);
    msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase._0_4_ = iVar2;
    iVar4 = IntField::getValue(&endSeqNo.super_SeqNumField);
    if (iVar2 < iVar4) {
      EndSeqNo::EndSeqNo((EndSeqNo *)&msg,(SEQNUM *)&msgSeqNum);
      FieldBase::operator=((FieldBase *)&endSeqNo,(FieldBase *)&msg);
      FieldBase::~FieldBase((FieldBase *)&msg);
    }
    iVar2 = IntField::getValue(&beginSeqNo.super_SeqNumField);
    iVar4 = IntField::getValue(&endSeqNo.super_SeqNumField);
    generateSequenceReset(this,iVar2,iVar4);
  }
  else {
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = IntField::getValue(&beginSeqNo.super_SeqNumField);
    iVar4 = IntField::getValue(&endSeqNo.super_SeqNumField);
    SessionState::get(this_00,iVar2,iVar4,&messages);
    msg.super_FieldMap._vptr_FieldMap._0_4_ = 0;
    MsgSeqNum::MsgSeqNum(&msgSeqNum,(SEQNUM *)&msg);
    MsgType::MsgType(&msgType);
    local_46c = IntField::getValue(&beginSeqNo.super_SeqNumField);
    messageString._M_dataplus._M_p = (pointer)&messageString.field_2;
    messageString._M_string_length = 0;
    messageString.field_2._M_local_buf[0] = '\0';
    bVar1 = false;
    local_470 = 0;
    for (string = messages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        string != messages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; string = string + 1) {
      strMsgType._M_dataplus._M_p = (pointer)&strMsgType.field_2;
      strMsgType._M_string_length = 0;
      strMsgType.field_2._M_local_buf[0] = '\0';
      dataDictionary =
           DataDictionaryProvider::getSessionDataDictionary
                     (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
      if (dataDictionary->m_storeMsgFieldsOrder == true) {
        std::__cxx11::string::find((char *)string,0x1c3e5d);
        std::__cxx11::string::find((char)string,1);
        std::__cxx11::string::substr((ulong)&msg,(ulong)string);
        std::__cxx11::string::operator=((string *)&strMsgType,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      if ((this->m_sessionID).m_isFIXT == true) {
        Message::Message(&msg);
        Message::setStringHeader(&msg,string);
        ApplVerID::ApplVerID(&applVerID);
        bVar1 = FieldMap::getFieldIfSet(&msg.m_header.super_FieldMap,(FieldBase *)&applVerID);
        if (!bVar1) {
          ApplVerID::ApplVerID((ApplVerID *)&local_90,&this->m_senderDefaultApplVerID);
          FieldBase::operator=((FieldBase *)&applVerID,&local_90);
          FieldBase::~FieldBase(&local_90);
        }
        applicationDataDictionary =
             DataDictionaryProvider::getApplicationDataDictionary
                       (&this->m_dataDictionaryProvider,&applVerID);
        if (strMsgType._M_string_length == 0) {
          this_01 = (Message *)operator_new(0x158);
          Message::Message(this_01,string,dataDictionary,applicationDataDictionary,
                           this->m_validateLengthAndChecksum);
        }
        else {
          pmVar5 = DataDictionary::getHeaderOrderedFields(dataDictionary);
          pmVar6 = DataDictionary::getTrailerOrderedFields(dataDictionary);
          pmVar7 = DataDictionary::getMessageOrderedFields(applicationDataDictionary,&strMsgType);
          this_01 = (Message *)operator_new(0x158);
          Message::Message(this_01,pmVar5,pmVar6,pmVar7,string,dataDictionary,
                           applicationDataDictionary,this->m_validateLengthAndChecksum);
        }
        FieldBase::~FieldBase((FieldBase *)&applVerID);
        Message::~Message(&msg);
      }
      else if (strMsgType._M_string_length == 0) {
        this_01 = (Message *)operator_new(0x158);
        Message::Message(this_01,string,dataDictionary,this->m_validateLengthAndChecksum);
      }
      else {
        pmVar5 = DataDictionary::getHeaderOrderedFields(dataDictionary);
        pmVar6 = DataDictionary::getTrailerOrderedFields(dataDictionary);
        pmVar7 = DataDictionary::getMessageOrderedFields(dataDictionary,&strMsgType);
        this_01 = (Message *)operator_new(0x158);
        Message::Message(this_01,pmVar5,pmVar6,pmVar7,string,dataDictionary,
                         this->m_validateLengthAndChecksum);
      }
      FieldMap::getField(&(this_01->m_header).super_FieldMap,(FieldBase *)&msgSeqNum);
      FieldMap::getField(&(this_01->m_header).super_FieldMap,(FieldBase *)&msgType);
      iVar4 = IntField::getValue(&msgSeqNum.super_SeqNumField);
      iVar2 = local_46c;
      if (local_470 != 0) {
        iVar2 = local_470;
      }
      if (local_46c == iVar4) {
        iVar2 = local_470;
      }
      bVar1 = Message::isAdminMsgType(&msgType);
      if ((bVar1) || (bVar1 = resend(this,this_01), !bVar1)) {
        if (iVar2 == 0) {
          iVar2 = IntField::getValue(&msgSeqNum.super_SeqNumField);
        }
        bVar1 = false;
      }
      else {
        if (iVar2 != 0) {
          iVar4 = IntField::getValue(&msgSeqNum.super_SeqNumField);
          generateSequenceReset(this,iVar2,iVar4);
        }
        __n = 9;
        iVar2 = 10;
        psVar8 = Message::toString(this_01,&messageString,8,9,10);
        send(this,(int)psVar8,__buf,__n,iVar2);
        uVar3 = IntField::getValue(&msgSeqNum.super_SeqNumField);
        IntConvertor::convert_abi_cxx11_((string *)&applVerID,(IntConvertor *)(ulong)uVar3,value_01)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                       "Resending Message: ",(string *)&applVerID);
        SessionState::onEvent(this_00,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&applVerID);
        iVar2 = 0;
        bVar1 = true;
      }
      local_46c = IntField::getValue(&msgSeqNum.super_SeqNumField);
      local_46c = local_46c + 1;
      std::__cxx11::string::~string((string *)&strMsgType);
      (*(this_01->super_FieldMap)._vptr_FieldMap[1])(this_01);
      local_470 = iVar2;
    }
    if (local_470 != 0) {
      iVar2 = IntField::getValue(&msgSeqNum.super_SeqNumField);
      generateSequenceReset(this,local_470,iVar2 + 1);
    }
    iVar2 = IntField::getValue(&endSeqNo.super_SeqNumField);
    iVar4 = IntField::getValue(&msgSeqNum.super_SeqNumField);
    if (iVar4 < iVar2) {
      iVar2 = IntField::getValue(&endSeqNo.super_SeqNumField);
      applVerID.super_StringField.super_FieldBase._vptr_FieldBase._0_4_ = iVar2 + 1;
      EndSeqNo::EndSeqNo((EndSeqNo *)&msg,(SEQNUM *)&applVerID);
      FieldBase::operator=((FieldBase *)&endSeqNo,(FieldBase *)&msg);
      FieldBase::~FieldBase((FieldBase *)&msg);
      applVerID.super_StringField.super_FieldBase._vptr_FieldBase._0_4_ =
           SessionState::getNextSenderMsgSeqNum(this_00);
      iVar2 = IntField::getValue(&endSeqNo.super_SeqNumField);
      if ((int)applVerID.super_StringField.super_FieldBase._vptr_FieldBase < iVar2) {
        EndSeqNo::EndSeqNo((EndSeqNo *)&msg,(SEQNUM *)&applVerID);
        FieldBase::operator=((FieldBase *)&endSeqNo,(FieldBase *)&msg);
        FieldBase::~FieldBase((FieldBase *)&msg);
      }
      if (bVar1) {
        local_90._vptr_FieldBase._0_4_ = IntField::getValue(&msgSeqNum.super_SeqNumField);
        local_90._vptr_FieldBase._0_4_ = (int)local_90._vptr_FieldBase + 1;
        BeginSeqNo::BeginSeqNo((BeginSeqNo *)&msg,(SEQNUM *)&local_90);
        FieldBase::operator=((FieldBase *)&beginSeqNo,(FieldBase *)&msg);
        FieldBase::~FieldBase((FieldBase *)&msg);
      }
      iVar2 = IntField::getValue(&beginSeqNo.super_SeqNumField);
      iVar4 = IntField::getValue(&endSeqNo.super_SeqNumField);
      generateSequenceReset(this,iVar2,iVar4);
    }
    FieldMap::getField(&(resendRequest->m_header).super_FieldMap,(FieldBase *)&msgSeqNum);
    bVar1 = isTargetTooHigh(this,&msgSeqNum);
    if ((!bVar1) && (bVar1 = isTargetTooLow(this,&msgSeqNum), !bVar1)) {
      SessionState::incrNextTargetMsgSeqNum(this_00);
    }
    std::__cxx11::string::~string((string *)&messageString);
    FieldBase::~FieldBase((FieldBase *)&msgType);
    FieldBase::~FieldBase((FieldBase *)&msgSeqNum);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&messages);
  }
  std::__cxx11::string::~string((string *)&beginString);
  FieldBase::~FieldBase((FieldBase *)&endSeqNo);
  FieldBase::~FieldBase((FieldBase *)&beginSeqNo);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void Session::nextResendRequest( const Message& resendRequest, const UtcTimeStamp& timeStamp )
{
  if ( !verify( resendRequest, false, false ) ) return ;

  Locker l( m_mutex );

  BeginSeqNo beginSeqNo;
  EndSeqNo endSeqNo;
  resendRequest.getField( beginSeqNo );
  resendRequest.getField( endSeqNo );

  m_state.onEvent( "Received ResendRequest FROM: "
       + IntConvertor::convert( beginSeqNo ) +
                   " TO: " + IntConvertor::convert( endSeqNo ) );

  std::string beginString = m_sessionID.getBeginString();
  if ( (beginString >= FIX::BeginString_FIX42 && endSeqNo == 0) ||
       (beginString <= FIX::BeginString_FIX42 && endSeqNo == 999999) ||
       (endSeqNo >= getExpectedSenderNum()) )
  { endSeqNo = getExpectedSenderNum() - 1; }

  if ( !m_persistMessages )
  {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    int next = m_state.getNextSenderMsgSeqNum();
    if( endSeqNo > next )
      endSeqNo = EndSeqNo(next);
    generateSequenceReset( beginSeqNo, endSeqNo );
    return;
  }

  std::vector < std::string > messages;
  m_state.get( beginSeqNo, endSeqNo, messages );

  std::vector < std::string > ::iterator i;
  MsgSeqNum msgSeqNum(0);
  MsgType msgType;
  int begin = 0;
  int current = beginSeqNo;
  bool appMessageJustSent = false;
  std::string messageString;

  for ( i = messages.begin(); i != messages.end(); ++i )
  {
    appMessageJustSent = false;
    SmartPtr<FIX::Message> pMsg;
    std::string strMsgType;
    const DataDictionary& sessionDD =
      m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if (sessionDD.isMessageFieldsOrderPreserved())
    {
      std::string::size_type equalSign = (*i).find("\00135=");
      equalSign += 4;
      std::string::size_type soh = (*i).find_first_of('\001', equalSign);
      strMsgType = (*i).substr(equalSign, soh - equalSign);
#ifdef HAVE_EMX
      if (FIX::Message::isAdminMsgType(strMsgType) == false)
      {
        equalSign = (*i).find("\0019426=", soh);
        if (equalSign == std::string::npos)
          throw FIX::IOException("EMX message type (9426) not found");

        equalSign += 6;
        soh = (*i).find_first_of('\001', equalSign);
        if (soh == std::string::npos)
          throw FIX::IOException("EMX message type (9426) soh char not found");
        strMsgType.assign((*i).substr(equalSign, soh - equalSign));
      }
#endif
    }

    if( m_sessionID.isFIXT() )
    {
      Message msg;
      msg.setStringHeader(*i);
      ApplVerID applVerID;
      if( !msg.getHeader().getFieldIfSet(applVerID) )
        applVerID = m_senderDefaultApplVerID;

      const DataDictionary& applicationDD =
          m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      if (strMsgType.empty())
        pMsg.reset( new Message( *i, sessionDD, applicationDD, m_validateLengthAndChecksum ));
      else
      {
        const message_order & headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order & trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order & messageOrder = applicationDD.getMessageOrderedFields(strMsgType);
        pMsg.reset( new Message( headerOrder, trailerOrder, messageOrder, *i, sessionDD, applicationDD, m_validateLengthAndChecksum ));
      }
    }
    else
    {
      if (strMsgType.empty())
        pMsg.reset( new Message( *i, sessionDD, m_validateLengthAndChecksum ));
      else
      {
        const message_order & headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order & trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order & messageOrder = sessionDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(headerOrder, trailerOrder, messageOrder, *i, sessionDD, m_validateLengthAndChecksum ));
      }
    }

    Message & msg = *pMsg;

    msg.getHeader().getField( msgSeqNum );
    msg.getHeader().getField( msgType );

    if( (current != msgSeqNum) && !begin )
      begin = current;

    if ( Message::isAdminMsgType( msgType ) )
    {
      if ( !begin ) begin = msgSeqNum;
    }
    else
    {
      if ( resend( msg ) )
      {
        if ( begin ) generateSequenceReset( begin, msgSeqNum );
        send( msg.toString(messageString) );
        m_state.onEvent( "Resending Message: "
                         + IntConvertor::convert( msgSeqNum ) );
        begin = 0;
        appMessageJustSent = true;
      }
      else
      { if ( !begin ) begin = msgSeqNum; }
    }
    current = msgSeqNum + 1;
  }
  if ( begin )
  {
    generateSequenceReset( begin, msgSeqNum + 1 );
  }

  if ( endSeqNo > msgSeqNum )
  {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    int next = m_state.getNextSenderMsgSeqNum();
    if( endSeqNo > next )
      endSeqNo = EndSeqNo(next);
    if ( appMessageJustSent )
      beginSeqNo = msgSeqNum + 1;
    generateSequenceReset( beginSeqNo, endSeqNo );
  }

  resendRequest.getHeader().getField( msgSeqNum );
  if( !isTargetTooHigh(msgSeqNum) && !isTargetTooLow(msgSeqNum) )
    m_state.incrNextTargetMsgSeqNum();
}